

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

int match(char *name,int argc,char **argv)

{
  bool bVar1;
  RE2 local_120;
  StringPiece local_40;
  int local_2c;
  char **ppcStack_28;
  int i;
  char **argv_local;
  char *pcStack_18;
  int argc_local;
  char *name_local;
  
  if (argc == 1) {
    name_local._4_4_ = 1;
  }
  else {
    ppcStack_28 = argv;
    argv_local._4_4_ = argc;
    pcStack_18 = name;
    for (local_2c = 1; local_2c < argv_local._4_4_; local_2c = local_2c + 1) {
      re2::StringPiece::StringPiece(&local_40,pcStack_18);
      re2::RE2::RE2(&local_120,ppcStack_28[local_2c]);
      bVar1 = re2::RE2::PartialMatch<>(&local_40,&local_120);
      re2::RE2::~RE2(&local_120);
      if (bVar1) {
        return 1;
      }
    }
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

static int match(const char* name, int argc, const char** argv) {
	if(argc == 1)
		return 1;
	for(int i = 1; i < argc; i++)
		if(RE2::PartialMatch(name, argv[i]))
			return 1;
	return 0;
}